

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O0

time_t __thiscall Server::Private::time(Private *this,time_t *__timer)

{
  int64 iVar1;
  ICallback *in_RDX;
  TimerImpl *local_30;
  TimerImpl *local_28;
  TimerImpl *timer;
  ICallback *callback_local;
  int64 interval_local;
  Private *this_local;
  
  callback_local = (ICallback *)__timer;
  interval_local = (int64)this;
  iVar1 = Time::ticks();
  local_30 = PoolList<Server::Private::TimerImpl>::append<Server::Timer::ICallback&,long,long>
                       (&this->_timers,in_RDX,(long)(callback_local + iVar1),(long)callback_local);
  local_28 = local_30;
  MultiMap<long,_Server::Private::TimerImpl_*>::insert
            (&this->_queuedTimers,&local_30->executionTime,&local_30);
  return (time_t)local_28;
}

Assistant:

Server::Timer *Server::Private::time(int64 interval, Timer::ICallback &callback)
{
  TimerImpl &timer = _timers.append<Timer::ICallback&, int64, int64>(callback, Time::ticks() + interval, interval);
  _queuedTimers.insert(timer.executionTime, &timer);
  return (Server::Timer *)&timer;
}